

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

uchar duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<long,unsigned_char>
                (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  byte bVar1;
  PhysicalType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_128;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if (0xff < (ulong)input) {
    TypeIdToString_abi_cxx11_(&local_48,(duckdb *)0x9,(PhysicalType)idx);
    ::std::operator+(&local_c8,"Type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48)
    ;
    ::std::operator+(&local_a8,&local_c8," with value ");
    ConvertToString::Operation<long>(&local_e8,input);
    ::std::operator+(&local_88,&local_a8,&local_e8);
    ::std::operator+(&local_68,&local_88,
                     " can\'t be cast because the value is out of range for the destination type ");
    TypeIdToString_abi_cxx11_(&local_108,(duckdb *)0x2,type);
    ::std::operator+(&bStack_128,&local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108
                    );
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_48);
    bVar1 = HandleVectorCastError::Operation<unsigned_char>
                      (&bStack_128,mask,idx,(VectorTryCastData *)dataptr);
    input = (long)bVar1;
    ::std::__cxx11::string::~string((string *)&bStack_128);
  }
  return (uchar)input;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}